

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

Layer * ncnn::Convolution_x86_layer_creator(void)

{
  Convolution_x86 *this;
  
  this = (Convolution_x86 *)operator_new(0x308);
  Convolution_x86::Convolution_x86(this);
  return (Layer *)((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
}

Assistant:

Convolution_x86::Convolution_x86()
{
    activation = 0;
    convolution_dilation1 = 0;
}